

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_constant_variable.cpp
# Opt level: O2

ir_visitor_status __thiscall
anon_unknown.dwarf_8cf23::ir_constant_variable_visitor::visit_enter
          (ir_constant_variable_visitor *this,ir_assignment *ir)

{
  ir_rvalue *piVar1;
  int iVar2;
  undefined4 extraout_var;
  assignment_entry *paVar3;
  ir_variable *piVar4;
  void *pvVar5;
  undefined4 extraout_var_00;
  
  iVar2 = (*(ir->lhs->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[8])();
  paVar3 = get_assignment_entry((ir_variable *)CONCAT44(extraout_var,iVar2),this->ht);
  if (paVar3 != (assignment_entry *)0x0) {
    iVar2 = paVar3->assignment_count;
    paVar3->assignment_count = iVar2 + 1;
    if (((iVar2 < 1) && (paVar3->var->constant_value == (ir_constant *)0x0)) &&
       (ir->condition == (ir_rvalue *)0x0)) {
      piVar4 = ir_assignment::whole_variable_written(ir);
      if ((piVar4 != (ir_variable *)0x0) &&
         (((undefined1  [44])piVar4->data & (undefined1  [44])0xe000) != (undefined1  [44])0x2000))
      {
        piVar1 = ir->rhs;
        pvVar5 = ralloc_parent(ir);
        iVar2 = (*(piVar1->super_ir_instruction)._vptr_ir_instruction[6])(piVar1,pvVar5,0);
        if ((ir_constant *)CONCAT44(extraout_var_00,iVar2) != (ir_constant *)0x0) {
          paVar3->constval = (ir_constant *)CONCAT44(extraout_var_00,iVar2);
        }
      }
    }
    return visit_continue;
  }
  __assert_fail("entry",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/opt_constant_variable.cpp"
                ,0x69,
                "virtual ir_visitor_status (anonymous namespace)::ir_constant_variable_visitor::visit_enter(ir_assignment *)"
               );
}

Assistant:

ir_visitor_status
ir_constant_variable_visitor::visit_enter(ir_assignment *ir)
{
   ir_constant *constval;
   struct assignment_entry *entry;

   entry = get_assignment_entry(ir->lhs->variable_referenced(), this->ht);
   assert(entry);
   entry->assignment_count++;

   /* If there's more than one assignment, don't bother - we won't do anything
    * with this variable anyway, and continuing just wastes memory cloning
    * constant expressions.
    */
   if (entry->assignment_count > 1)
      return visit_continue;

   /* If it's already constant, don't do the work. */
   if (entry->var->constant_value)
      return visit_continue;

   /* OK, now find if we actually have all the right conditions for
    * this to be a constant value assigned to the var.
    */
   if (ir->condition)
      return visit_continue;

   ir_variable *var = ir->whole_variable_written();
   if (!var)
      return visit_continue;

   /* Ignore buffer variables, since the underlying storage is shared
    * and we can't be sure that this variable won't be written by another
    * thread.
    */
   if (var->data.mode == ir_var_shader_storage ||
       var->data.mode == ir_var_shader_shared)
      return visit_continue;

   constval = ir->rhs->constant_expression_value(ralloc_parent(ir));
   if (!constval)
      return visit_continue;

   /* Mark this entry as having a constant assignment (if the
    * assignment count doesn't go >1).  do_constant_variable will fix
    * up the variable with the constant value later.
    */
   entry->constval = constval;

   return visit_continue;
}